

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseUtils.h
# Opt level: O3

bool __thiscall Minisat::StringOption::parse(StringOption *this,char *str)

{
  char *pcVar1;
  long lVar2;
  long lVar3;
  char cVar4;
  char *span;
  
  if (*str == '-') {
    pcVar1 = (this->super_Option).name;
    lVar3 = 0;
    cVar4 = *pcVar1;
    while (cVar4 != '\0') {
      if (str[lVar3 + 1] != cVar4) {
        return false;
      }
      lVar2 = lVar3 + 1;
      lVar3 = lVar3 + 1;
      cVar4 = pcVar1[lVar2];
    }
    if (str[lVar3 + 1] == '=') {
      this->value = str + lVar3 + 2;
      return true;
    }
  }
  return false;
}

Assistant:

static bool match(B& in, const char* str) {
    int i;
    for (i = 0; str[i] != '\0'; i++)
        if (in[i] != str[i])
            return false;

    in += i;

    return true; 
}